

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_FCPY(DisasContext_conflict1 *s,arg_FCPY *a)

{
  int iVar1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  uint64_t val;
  TCGv_i64 pTVar3;
  uintptr_t o;
  
  iVar1 = a->esz;
  if (iVar1 != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    _Var2 = sve_access_check_aarch64(s);
    if (_Var2) {
      val = vfp_expand_imm_aarch64(a->esz,(uint8_t)a->imm);
      pTVar3 = tcg_const_i64_aarch64(tcg_ctx,val);
      do_cpy_m((DisasContext_conflict1 *)(ulong)(uint)s->sve_len,(int)s->uc->tcg_ctx,a->esz,a->rd,
               a->rn,(TCGv_i64)(ulong)(uint)a->pg);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    }
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_FCPY(DisasContext *s, arg_FCPY *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        /* Decode the VFP immediate.  */
        uint64_t imm = vfp_expand_imm(a->esz, a->imm);
        TCGv_i64 t_imm = tcg_const_i64(tcg_ctx, imm);
        do_cpy_m(s, a->esz, a->rd, a->rn, a->pg, t_imm);
        tcg_temp_free_i64(tcg_ctx, t_imm);
    }
    return true;
}